

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::ShoutyToPascalCase
          (string *__return_storage_ptr__,csharp *this,string *input)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(long *)(this + 8) != 0) {
    uVar1 = 0;
    do {
      if (((byte)(*(byte *)(*(long *)this + uVar1) - 0x30) < 10) ||
         ((byte)((*(byte *)(*(long *)this + uVar1) & 0xdf) + 0xbf) < 0x1a)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < *(ulong *)(this + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ShoutyToPascalCase(const std::string& input) {
  string result;
  // Simple way of implementing "always start with upper"
  char previous = '_';
  for (int i = 0; i < input.size(); i++) {
    char current = input[i];
    if (!ascii_isalnum(current)) {
      previous = current;
      continue;      
    }
    if (!ascii_isalnum(previous)) {
      result += ascii_toupper(current);
    } else if (ascii_isdigit(previous)) {
      result += ascii_toupper(current);
    } else if (ascii_islower(previous)) {
      result += current;
    } else {
      result += ascii_tolower(current);
    }
    previous = current;
  }
  return result;
}